

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtGStateRegistry.cpp
# Opt level: O0

ObjectIDTypeAndBool __thiscall
ExtGStateRegistry::RegisterExtGStateForOpacity(ExtGStateRegistry *this,double inAlphaValue)

{
  bool bVar1;
  IndirectObjectsReferenceRegistry *this_00;
  pointer ppVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>,_bool> pVar4;
  ObjectIDTypeAndBool OVar5;
  bool local_7a;
  bool local_79;
  _Base_ptr local_78;
  undefined1 local_70;
  pair<const_double,_unsigned_long> local_68;
  _Base_ptr local_58;
  undefined1 local_50;
  ObjectIDType local_48;
  ObjectIDType objectId;
  _Self local_38;
  iterator it;
  double local_28;
  double inAlphaValue_local;
  ExtGStateRegistry *this_local;
  bool local_10;
  
  local_28 = inAlphaValue;
  inAlphaValue_local = (double)this;
  if (this->mObjectsContext == (ObjectsContext *)0x0) {
    it._M_node._4_4_ = 0;
    it._M_node._3_1_ = 0;
    std::pair<unsigned_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long,_bool> *)&this_local,(int *)((long)&it._M_node + 4),
               (bool *)((long)&it._M_node + 3));
    uVar3 = extraout_RDX;
  }
  else {
    local_38._M_node =
         (_Base_ptr)
         std::
         map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
         ::find(&this->mAlphaExtGstates,&local_28);
    objectId = (ObjectIDType)
               std::
               map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
               ::end(&this->mAlphaExtGstates);
    bVar1 = std::operator==(&local_38,(_Self *)&objectId);
    if (bVar1) {
      this_00 = ObjectsContext::GetInDirectObjectsRegistry(this->mObjectsContext);
      local_48 = IndirectObjectsReferenceRegistry::AllocateNewObjectID(this_00);
      std::pair<const_double,_unsigned_long>::pair<double_&,_unsigned_long_&,_true>
                (&local_68,&local_28,&local_48);
      pVar4 = std::
              map<double,_unsigned_long,_std::less<double>,_std::allocator<std::pair<const_double,_unsigned_long>_>_>
              ::insert(&this->mAlphaExtGstates,&local_68);
      local_78 = (_Base_ptr)pVar4.first._M_node;
      local_70 = pVar4.second;
      local_58 = local_78;
      local_50 = local_70;
      local_38._M_node = local_78;
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->
                         (&local_38);
      local_79 = true;
      std::pair<unsigned_long,_bool>::pair<unsigned_long_&,_bool,_true>
                ((pair<unsigned_long,_bool> *)&this_local,&ppVar2->second,&local_79);
      uVar3 = extraout_RDX_00;
    }
    else {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_double,_unsigned_long>_>::operator->
                         (&local_38);
      local_7a = false;
      std::pair<unsigned_long,_bool>::pair<unsigned_long_&,_bool,_true>
                ((pair<unsigned_long,_bool> *)&this_local,&ppVar2->second,&local_7a);
      uVar3 = extraout_RDX_01;
    }
  }
  OVar5._9_7_ = (undefined7)((ulong)uVar3 >> 8);
  OVar5.second = local_10;
  OVar5.first = (unsigned_long)this_local;
  return OVar5;
}

Assistant:

ObjectIDTypeAndBool ExtGStateRegistry::RegisterExtGStateForOpacity(double inAlphaValue) {
    if(!mObjectsContext)
        return ObjectIDTypeAndBool(0,false);

    DoubleToObjectIDTypeMap::iterator it = mAlphaExtGstates.find(inAlphaValue);

    if(it == mAlphaExtGstates.end()) {
        ObjectIDType objectId = mObjectsContext->GetInDirectObjectsRegistry().AllocateNewObjectID();
        it = mAlphaExtGstates.insert(DoubleToObjectIDTypeMap::value_type(inAlphaValue,objectId)).first;
        return ObjectIDTypeAndBool(it->second,true);
    }

    return ObjectIDTypeAndBool(it->second, false);
}